

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_ftst_m68k(CPUM68KState_conflict *env,FPReg_conflict *val)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  
  uVar3 = ((val->d).high & 0x8000) << 0xc;
  uVar4 = (val->d).high & 0x7fff;
  lVar1 = (val->d).low * 2;
  if (lVar1 == 0 || uVar4 != 0x7fff) {
    if (lVar1 == 0 && uVar4 == 0x7fff) {
      uVar3 = uVar3 | 0x2000000;
    }
    else {
      uVar2 = uVar3 | 0x4000000;
      if ((val->d).low != 0) {
        uVar2 = uVar3;
      }
      if (uVar4 == 0) {
        uVar3 = uVar2;
      }
    }
  }
  else {
    uVar3 = uVar3 | 0x1000000;
  }
  env->fpsr = env->fpsr & 0xf0ffffff | uVar3;
  return;
}

Assistant:

void HELPER(ftst)(CPUM68KState *env, FPReg *val)
{
    uint32_t cc = 0;

    if (floatx80_is_neg(val->d)) {
        cc |= FPSR_CC_N;
    }

    if (floatx80_is_any_nan(val->d)) {
        cc |= FPSR_CC_A;
    } else if (floatx80_is_infinity(val->d)) {
        cc |= FPSR_CC_I;
    } else if (floatx80_is_zero(val->d)) {
        cc |= FPSR_CC_Z;
    }
    env->fpsr = (env->fpsr & ~FPSR_CC_MASK) | cc;
}